

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterable.h
# Opt level: O0

QConstIterator<QMetaSequence> __thiscall
QIterable<QMetaSequence>::constEnd(QIterable<QMetaSequence> *this)

{
  void *extraout_RDX;
  QMetaContainer *in_RSI;
  QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_> in_RDI;
  QConstIterator<QMetaSequence> QVar1;
  QIterable<QMetaSequence> *in_stack_ffffffffffffffc8;
  QConstIterator<QMetaSequence> *this_00;
  QTaggedPointer<QIterable<QMetaSequence>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaSequence>,_QIterable<QMetaSequence>_>::Tag>
  container;
  
  this_00 = (QConstIterator<QMetaSequence> *)(in_RSI + 2);
  container = in_RDI.m_pointer.d;
  constIterable((QIterable<QMetaSequence> *)0x3c195a);
  QMetaContainer::constEnd(in_RSI,(void *)container.d);
  QConstIterator<QMetaSequence>::QConstIterator(this_00,in_stack_ffffffffffffffc8,(void *)0x3c1979);
  QVar1.super_QBaseIterator<QMetaSequence>.m_iterator = extraout_RDX;
  QVar1.super_QBaseIterator<QMetaSequence>.m_iterable.m_pointer.d = in_RDI.m_pointer.d;
  return (QConstIterator<QMetaSequence>)QVar1.super_QBaseIterator<QMetaSequence>;
}

Assistant:

QConstIterator<Container> constEnd() const
    {
        return QConstIterator(this, m_metaContainer.constEnd(constIterable()));
    }